

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    bb_local._7_1_ = false;
  }
  else if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
          (GImGui->CurrentWindow->RootWindow != GImGui->HoveredWindow->RootWindow)) {
    bb_local._7_1_ = false;
  }
  else {
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x33ed,"bool ImGui::BeginDragDropTargetCustom(const ImRect &, ImGuiID)");
    }
    bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if ((bVar2) && (id != (pIVar1->DragDropPayload).SourceId)) {
      (pIVar1->DragDropTargetRect).Min = bb->Min;
      (pIVar1->DragDropTargetRect).Max = bb->Max;
      pIVar1->DragDropTargetId = id;
      bb_local._7_1_ = true;
    }
    else {
      bb_local._7_1_ = false;
    }
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;

    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    return true;
}